

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmSourceGroup * __thiscall
cmMakefile::GetSourceGroup
          (cmMakefile *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *name)

{
  int iVar1;
  char *pcVar2;
  pointer pbVar3;
  cmSourceGroup *this_00;
  ulong uVar4;
  ulong uVar5;
  pointer this_01;
  bool bVar6;
  string sgName;
  allocator local_51;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  this_01 = (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (this_01 ==
      (this->SourceGroups).super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
      .super__Vector_impl_data._M_finish) {
    this_00 = (cmSourceGroup *)0x0;
  }
  else {
    this_00 = (cmSourceGroup *)0x0;
    do {
      pcVar2 = cmSourceGroup::GetName(this_01);
      std::__cxx11::string::string((string *)&local_50,pcVar2,&local_51);
      pbVar3 = (name->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (local_48 == pbVar3->_M_string_length) {
        if (local_48 == 0) {
          bVar6 = true;
        }
        else {
          iVar1 = bcmp(local_50,(pbVar3->_M_dataplus)._M_p,local_48);
          bVar6 = iVar1 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
        this_00 = this_01;
      }
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      this_01 = this_01 + 1;
    } while (!(bool)(bVar6 | this_01 ==
                             (this->SourceGroups).
                             super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>.
                             _M_impl.super__Vector_impl_data._M_finish));
  }
  if (this_00 == (cmSourceGroup *)0x0) {
LAB_0036a7d8:
    this_00 = (cmSourceGroup *)0x0;
  }
  else {
    pbVar3 = (name->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (0x20 < (ulong)((long)(name->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3)) {
      uVar4 = 1;
      uVar5 = 2;
      do {
        this_00 = cmSourceGroup::LookupChild(this_00,pbVar3[uVar4]._M_dataplus._M_p);
        if (this_00 == (cmSourceGroup *)0x0) goto LAB_0036a7d8;
        pbVar3 = (name->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        bVar6 = uVar5 < (ulong)((long)(name->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar3 >>
                               5);
        uVar4 = uVar5;
        uVar5 = (ulong)((int)uVar5 + 1);
      } while (bVar6);
    }
  }
  return this_00;
}

Assistant:

cmSourceGroup*
cmMakefile::GetSourceGroup(const std::vector<std::string>&name) const
{
  cmSourceGroup* sg = 0;

  // first look for source group starting with the same as the one we wants
  for (std::vector<cmSourceGroup>::const_iterator
      sgIt = this->SourceGroups.begin();
      sgIt != this->SourceGroups.end(); ++sgIt)
    {
    std::string sgName = sgIt->GetName();
    if(sgName == name[0])
      {
      sg = const_cast<cmSourceGroup*>(&(*sgIt));
      break;
      }
    }

  if(sg != 0)
    {
    // iterate through its children to find match source group
    for(unsigned int i=1; i<name.size(); ++i)
      {
      sg = sg->LookupChild(name[i].c_str());
      if(sg == 0)
        {
        break;
        }
      }
    }
  return sg;
}